

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

Station * __thiscall imrt::Station::operator=(Station *this,Station *s)

{
  const_iterator __k;
  pointer ppVar1;
  mapped_type *ppMVar2;
  long in_RSI;
  Station *in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_00000038;
  vector<double,_std::allocator<double>_> *in_stack_00000040;
  Matrix *aux;
  int i;
  Collimator *in_stack_ffffffffffffff98;
  Collimator *in_stack_ffffffffffffffa0;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> *this_00;
  Matrix *in_stack_ffffffffffffffa8;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_stack_ffffffffffffffb8;
  Matrix *in_stack_ffffffffffffffc0;
  pair<int,_int> in_stack_ffffffffffffffc8;
  int local_14;
  
  Collimator::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  in_RDI->angle = *(int *)(in_RSI + 8);
  in_RDI->max_apertures = *(int *)(in_RSI + 0x40);
  in_RDI->max_intensity = *(int *)(in_RSI + 0x44);
  in_RDI->min_intensity = *(int *)(in_RSI + 0x48);
  in_RDI->initial_intensity = *(int *)(in_RSI + 0x4c);
  in_RDI->step_intensity = *(int *)(in_RSI + 0x50);
  in_RDI->n_volumes = *(int *)(in_RSI + 0x54);
  for (local_14 = 0; local_14 < in_RDI->n_volumes; local_14 = local_14 + 1) {
    __k = std::
          map<int,_const_maths::Matrix_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_maths::Matrix_*>_>_>
          ::find((map<int,_const_maths::Matrix_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_maths::Matrix_*>_>_>
                  *)in_stack_ffffffffffffff98,(key_type_conflict *)0x1379fb);
    ppVar1 = std::_Rb_tree_const_iterator<std::pair<const_int,_const_maths::Matrix_*>_>::operator->
                       ((_Rb_tree_const_iterator<std::pair<const_int,_const_maths::Matrix_*>_> *)
                        0x137a0a);
    in_stack_ffffffffffffffa8 = ppVar1->second;
    ppMVar2 = std::
              map<int,_const_maths::Matrix_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_maths::Matrix_*>_>_>
              ::operator[]((map<int,_const_maths::Matrix_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_maths::Matrix_*>_>_>
                            *)in_stack_ffffffffffffffa8,(key_type_conflict *)__k._M_node);
    *ppMVar2 = in_stack_ffffffffffffffa8;
  }
  this_00 = (pair<std::pair<int,_int>,_std::pair<int,_int>_> *)&stack0xffffffffffffffc8;
  maths::Matrix::Matrix((Matrix *)in_RDI,in_stack_ffffffffffffffa8);
  maths::Matrix::operator=((Matrix *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  maths::Matrix::~Matrix((Matrix *)in_RDI);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000040,in_stack_00000038);
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::operator=((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               *)in_stack_00000040,
              (vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               *)in_stack_00000038);
  std::pair<std::pair<int,_int>,_std::pair<int,_int>_>::operator=
            (this_00,(type)in_stack_ffffffffffffff98);
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  ::operator=((map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               *)this_00,
              (map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               *)in_stack_ffffffffffffff98);
  std::
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  ::operator=((map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
               *)this_00,
              (map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
               *)in_stack_ffffffffffffff98);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::operator=
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)this_00,
             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             in_stack_ffffffffffffff98);
  return in_RDI;
}

Assistant:

Station& Station::operator=(const Station & s) {
    collimator=s.collimator;
    angle=s.angle;
    max_apertures=s.max_apertures;
    max_intensity=s.max_intensity;
    min_intensity=s.min_intensity;
    initial_intensity=s.initial_intensity;
    step_intensity=s.step_intensity;
    n_volumes=s.n_volumes;
    for (int i=0; i<n_volumes; i++) {
      const Matrix * aux= s.D.find(i)->second;
      D[i]=aux;
    }
    I= Matrix (s.I);
    //I= s.I;
    intensity=s.intensity;
    A=s.A;
    last_mem=s.last_mem;
    last_diff=s.last_diff;
    pos2beam=s.pos2beam;
    beam2pos=s.beam2pos;
    int2nb=s.int2nb;

    return(*this);
  }